

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_hdr_sync(bcf_hdr_t *h)

{
  uint *puVar1;
  bcf_idpair_t *pbVar2;
  uint local_28;
  uint local_24;
  int max_id;
  khint_t k;
  vdict_t *d;
  int i;
  bcf_hdr_t *h_local;
  
  for (d._4_4_ = 0; d._4_4_ < 3; d._4_4_ = d._4_4_ + 1) {
    puVar1 = (uint *)h->dict[d._4_4_];
    local_28 = 0xffffffff;
    for (local_24 = 0; local_24 < *puVar1; local_24 = local_24 + 1) {
      if (((*(uint *)(*(long *)(puVar1 + 4) + (ulong)(local_24 >> 4) * 4) >>
            (sbyte)((local_24 & 0xf) << 1) & 3) == 0) &&
         ((int)local_28 < *(int *)(*(long *)(puVar1 + 8) + (ulong)local_24 * 0x30 + 0x28))) {
        local_28 = *(uint *)(*(long *)(puVar1 + 8) + (ulong)local_24 * 0x30 + 0x28);
      }
    }
    if (h->n[d._4_4_] <= (int)local_28) {
      pbVar2 = (bcf_idpair_t *)realloc(h->id[d._4_4_],(long)(int)(local_28 + 1) << 4);
      h->id[d._4_4_] = pbVar2;
      for (local_24 = h->n[d._4_4_]; local_24 <= local_28; local_24 = local_24 + 1) {
        h->id[d._4_4_][local_24].key = (char *)0x0;
        h->id[d._4_4_][local_24].val = (bcf_idinfo_t *)0x0;
      }
      h->n[d._4_4_] = local_28 + 1;
    }
    for (local_24 = 0; local_24 < *puVar1; local_24 = local_24 + 1) {
      if ((*(uint *)(*(long *)(puVar1 + 4) + (ulong)(local_24 >> 4) * 4) >>
           (sbyte)((local_24 & 0xf) << 1) & 3) == 0) {
        h->id[d._4_4_][*(int *)(*(long *)(puVar1 + 8) + (ulong)local_24 * 0x30 + 0x28)].key =
             *(char **)(*(long *)(puVar1 + 6) + (ulong)local_24 * 8);
        h->id[d._4_4_][*(int *)(*(long *)(puVar1 + 8) + (ulong)local_24 * 0x30 + 0x28)].val =
             (bcf_idinfo_t *)(*(long *)(puVar1 + 8) + (ulong)local_24 * 0x30);
      }
    }
  }
  h->dirty = 0;
  return 0;
}

Assistant:

int bcf_hdr_sync(bcf_hdr_t *h)
{
    int i;
    for (i = 0; i < 3; i++)
    {
        vdict_t *d = (vdict_t*)h->dict[i];
        khint_t k;

        // find out the largest id, there may be holes because of IDX
        int max_id = -1;
        for (k=kh_begin(d); k<kh_end(d); k++)
        {
            if (!kh_exist(d,k)) continue;
            if ( max_id < kh_val(d,k).id ) max_id = kh_val(d,k).id;
        }
        if ( max_id >= h->n[i] )
        {
            h->id[i] = (bcf_idpair_t*)realloc(h->id[i], (max_id+1)*sizeof(bcf_idpair_t));
            for (k=h->n[i]; k<=max_id; k++)
            {
                h->id[i][k].key = NULL;
                h->id[i][k].val = NULL;
            }
            h->n[i] = max_id+1;
        }
        for (k=kh_begin(d); k<kh_end(d); k++)
        {
            if (!kh_exist(d,k)) continue;
            h->id[i][kh_val(d,k).id].key = kh_key(d,k);
            h->id[i][kh_val(d,k).id].val = &kh_val(d,k);
        }
    }
    h->dirty = 0;
    return 0;
}